

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O0

int32_t __thiscall
icu_63::RuleBasedBreakIterator::getRuleStatusVec
          (RuleBasedBreakIterator *this,int32_t *fillInVec,int32_t capacity,UErrorCode *status)

{
  UBool UVar1;
  int local_3c;
  int local_38;
  int i;
  int32_t numValsToCopy;
  int32_t numVals;
  UErrorCode *status_local;
  int32_t capacity_local;
  int32_t *fillInVec_local;
  RuleBasedBreakIterator *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    this_local._4_4_ = this->fData->fRuleStatusTable[this->fRuleStatusIndex];
    local_38 = this_local._4_4_;
    if (capacity < this_local._4_4_) {
      *status = U_BUFFER_OVERFLOW_ERROR;
      local_38 = capacity;
    }
    for (local_3c = 0; local_3c < local_38; local_3c = local_3c + 1) {
      fillInVec[local_3c] = this->fData->fRuleStatusTable[this->fRuleStatusIndex + local_3c + 1];
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t RuleBasedBreakIterator::getRuleStatusVec(
             int32_t *fillInVec, int32_t capacity, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return 0;
    }

    int32_t  numVals = fData->fRuleStatusTable[fRuleStatusIndex];
    int32_t  numValsToCopy = numVals;
    if (numVals > capacity) {
        status = U_BUFFER_OVERFLOW_ERROR;
        numValsToCopy = capacity;
    }
    int i;
    for (i=0; i<numValsToCopy; i++) {
        fillInVec[i] = fData->fRuleStatusTable[fRuleStatusIndex + i + 1];
    }
    return numVals;
}